

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::ModeFunction<duckdb::ModeStandard<unsigned_short>>::
     Window<duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>,unsigned_short,unsigned_short>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  bool bVar1;
  unsigned_short uVar2;
  SubFrames *rights;
  UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
  *op;
  MAP_TYPE *pMVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pFVar7;
  pointer pvVar8;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_RCX;
  long in_RSI;
  Vector *in_R9;
  long in_stack_00000008;
  const_iterator highest_frequency;
  Updater updater;
  idx_t i;
  FrameBounds *frame;
  const_iterator __end4;
  const_iterator __begin4;
  SubFrames *__range4;
  size_t tau_inverse;
  ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_> included;
  SubFrames *prevs;
  ValidityMask *rmask;
  unsigned_short *rdata;
  ValidityMask *fmask;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *state;
  unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffff28;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_stack_ffffffffffffff30;
  idx_t *in_stack_ffffffffffffff38;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_stack_ffffffffffffff40;
  TemplatedValidityMask<unsigned_long> *this;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false>
  in_stack_ffffffffffffff48;
  _Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false>
  in_stack_ffffffffffffff50;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_stack_ffffffffffffff58;
  ulong local_98;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff70;
  WindowPartitionInput *in_stack_ffffffffffffff78;
  __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
  in_stack_ffffffffffffff80;
  ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_> local_68;
  ValidityMask *fmask_p;
  
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::InitializePage
            ((ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)
             in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78);
  fmask_p = *(ValidityMask **)(in_RSI + 0x58);
  rights = (SubFrames *)FlatVector::GetData<unsigned_short>((Vector *)0xb05aa5);
  op = (UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
        *)FlatVector::Validity((Vector *)0xb05aba);
  bVar1 = std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::empty
                    (in_stack_ffffffffffffff40);
  if (bVar1) {
    std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)
               in_stack_ffffffffffffff50._M_cur,(size_type)in_stack_ffffffffffffff48._M_cur);
  }
  ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_>::
  ModeIncluded(&local_68,fmask_p,in_RCX);
  if (in_RCX->frequency_map == (Counts *)0x0) {
    duckdb::Allocator::DefaultAllocator();
    pMVar3 = ModeStandard<unsigned_short>::CreateEmpty((Allocator *)in_stack_ffffffffffffff30);
    in_RCX->frequency_map = pMVar3;
  }
  this = (TemplatedValidityMask<unsigned_long> *)in_RCX->nonzero;
  sVar4 = std::
          unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
          ::size((unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
                  *)0xb05b67);
  if ((TemplatedValidityMask<unsigned_long> *)(sVar4 >> 2) < this) {
    pvVar5 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff38 = (idx_t *)pvVar5->end;
    pvVar6 = vector<duckdb::FrameBounds,_true>::front((vector<duckdb::FrameBounds,_true> *)0xb05b9b)
    ;
    if ((idx_t *)pvVar6->start < in_stack_ffffffffffffff38) {
      pvVar6 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff30 =
           (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)pvVar6->end;
      pvVar5 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)0xb05bcb);
      if ((ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)pvVar5->start <
          in_stack_ffffffffffffff30) {
        ModeFunction<duckdb::ModeStandard<unsigned_short>_>::
        UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
        ::UpdateWindowState((UpdateWindowState<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>,_unsigned_short>
                             *)&stack0xffffffffffffff58,in_RCX,&local_68);
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<unsigned_short>>::UpdateWindowState<duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>,unsigned_short>>
                  ((SubFrames *)fmask_p,rights,op);
        goto LAB_00b05cd2;
      }
    }
  }
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::Reset(in_stack_ffffffffffffff30)
  ;
  std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::begin
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)
             in_stack_ffffffffffffff28);
  std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::end
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)
             in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    pFVar7 = __gnu_cxx::
             __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
             ::operator*((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                          *)&stack0xffffffffffffff80);
    for (local_98 = pFVar7->start; local_98 < pFVar7->end; local_98 = local_98 + 1) {
      bVar1 = ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_>
              ::operator()((ModeIncluded<duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>_>
                            *)this,in_stack_ffffffffffffff38);
      if (bVar1) {
        ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::ModeAdd
                  ((ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)
                   in_stack_ffffffffffffff50._M_cur,(idx_t)in_stack_ffffffffffffff48._M_cur);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
    ::operator++((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                  *)&stack0xffffffffffffff80);
  }
LAB_00b05cd2:
  if ((in_RCX->valid & 1U) == 0) {
    ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::Scan
              (in_stack_ffffffffffffff58);
    std::
    unordered_map<unsigned_short,_duckdb::ModeAttr,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>_>
    ::end(in_stack_ffffffffffffff28);
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false>
                        *)&stack0xffffffffffffff50,
                       (_Node_iterator_base<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false>
                        *)&stack0xffffffffffffff48);
    if (bVar1) {
      pvVar8 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                             *)0xb05d2b);
      *in_RCX->mode = pvVar8->first;
      pvVar8 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_short,_duckdb::ModeAttr>,_false,_false>
                             *)0xb05d47);
      in_RCX->count = (pvVar8->second).count;
      in_RCX->valid = in_RCX->count != 0;
    }
  }
  if ((in_RCX->valid & 1U) == 0) {
    TemplatedValidityMask<unsigned_long>::Set
              (this,(idx_t)in_stack_ffffffffffffff38,
               SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
  }
  else {
    uVar2 = ModeStandard<unsigned_short>::Assign<unsigned_short,unsigned_short>(in_R9,*in_RCX->mode)
    ;
    *(unsigned_short *)
     ((long)&(rights->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start + in_stack_00000008 * 2) = uVar2;
  }
  vector<duckdb::FrameBounds,_true>::operator=
            (&in_stack_ffffffffffffff30->prevs,
             (vector<duckdb::FrameBounds,_true> *)in_stack_ffffffffffffff28);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}